

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionCompiler.cpp
# Opt level: O3

bool __thiscall OpenMD::SelectionCompiler::lookingAtString(SelectionCompiler *this)

{
  uint uVar1;
  uint uVar2;
  pointer pcVar3;
  uint uVar4;
  ulong uVar5;
  char *pcVar6;
  bool bVar7;
  bool bVar8;
  
  uVar1 = this->ichToken;
  uVar2 = this->cchScript;
  if ((uVar1 == uVar2) || (pcVar3 = (this->script)._M_dataplus._M_p, pcVar3[(int)uVar1] != '\"')) {
    return false;
  }
  uVar5 = (long)(int)uVar1 + 1;
  if ((int)uVar5 < (int)uVar2) {
    pcVar6 = pcVar3 + uVar5;
    bVar7 = false;
    uVar4 = uVar1 + 2;
    do {
      uVar5 = (ulong)uVar4;
      if ((*pcVar6 == '\"') && (!bVar7)) goto LAB_00260d14;
      bVar7 = (bool)((bVar7 ^ 1U) & *pcVar6 == '\\');
      pcVar6 = pcVar6 + 1;
      bVar8 = uVar4 != uVar2;
      uVar4 = uVar4 + 1;
    } while (bVar8);
    uVar5 = (ulong)uVar2;
  }
LAB_00260d14:
  this->cchToken = (int)uVar5 - uVar1;
  return true;
}

Assistant:

bool SelectionCompiler::lookingAtString() {
    if (ichToken == cchScript) return false;
    if (script[ichToken] != '"') return false;
    // remove support for single quote
    // in order to use it in atom expressions
    //    char chFirst = script.charAt(ichToken);
    //    if (chFirst != '"' && chFirst != '\'')
    //      return false;
    int ichT = ichToken + 1;
    //    while (ichT < cchScript && script.charAt(ichT++) != chFirst)
    char ch;
    bool previousCharBackslash = false;
    while (ichT < cchScript) {
      ch = script[ichT++];
      if (ch == '"' && !previousCharBackslash) break;
      previousCharBackslash = ch == '\\' ? !previousCharBackslash : false;
    }
    cchToken = ichT - ichToken;

    return true;
  }